

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

Debug * __thiscall Corrade::Utility::Debug::operator<<(Debug *this,uchar value)

{
  bool bVar1;
  Debug *pDVar2;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_37;
  UnderlyingType local_36;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_35;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_34;
  UnderlyingType local_33;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_32;
  EnumSet local_31;
  Flags previousFlags;
  char *pcStack_30;
  char *shade;
  uint local_20;
  byte local_19;
  int v;
  uchar value_local;
  Debug *this_local;
  
  local_20 = (uint)value;
  shade._5_1_ = (this->_flags)._value;
  local_19 = value;
  _v = this;
  shade._6_1_ = Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::operator|
                          (&this->_immediateFlags,shade._5_1_);
  Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
            ((EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> *)((long)&shade + 4),
             Color);
  shade._7_1_ = Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::operator&
                          ((EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> *)
                           ((long)&shade + 6),shade._4_1_);
  bVar1 = Containers::EnumSet::operator_cast_to_bool((EnumSet *)((long)&shade + 7));
  if (bVar1) {
    if (local_19 < 0x33) {
      pcStack_30 = "  ";
    }
    else if (local_19 < 0x66) {
      pcStack_30 = anon_var_dwarf_19ca0;
    }
    else if (local_19 < 0x99) {
      pcStack_30 = anon_var_dwarf_19cb7;
    }
    else if (local_19 < 0xcc) {
      pcStack_30 = anon_var_dwarf_19cc2;
    }
    else {
      pcStack_30 = anon_var_dwarf_19ccd;
    }
    local_33 = (this->_flags)._value;
    local_32 = Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::operator|
                         (&this->_immediateFlags,local_33);
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
              (&local_34,DisableColors);
    local_31 = (EnumSet)Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::
                        operator&(&local_32,local_34);
    bVar1 = Containers::EnumSet::operator_cast_to_bool(&local_31);
    if (bVar1) {
      this_local = print<char_const*>(this,&stack0xffffffffffffffd0);
    }
    else {
      print<char[8]>(this,(char (*) [8])"\x1b[38;2;");
      local_35._value = (this->_flags)._value;
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                (&local_37,NoSpace);
      local_36 = (UnderlyingType)
                 Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::
                 operator|(&local_35,local_37);
      (this->_flags)._value = local_36;
      pDVar2 = operator<<(this,local_20);
      pDVar2 = operator<<(pDVar2,";");
      pDVar2 = operator<<(pDVar2,local_20);
      pDVar2 = operator<<(pDVar2,";");
      pDVar2 = operator<<(pDVar2,local_20);
      pDVar2 = operator<<(pDVar2,"m\x1b[48;2;");
      pDVar2 = operator<<(pDVar2,local_20);
      pDVar2 = operator<<(pDVar2,";");
      pDVar2 = operator<<(pDVar2,local_20);
      pDVar2 = operator<<(pDVar2,";");
      pDVar2 = operator<<(pDVar2,local_20);
      pDVar2 = operator<<(pDVar2,"m");
      pDVar2 = operator<<(pDVar2,pcStack_30);
      operator<<(pDVar2,"\x1b[0m");
      (this->_flags)._value = local_35._value;
      this_local = this;
    }
  }
  else {
    this_local = print<int>(this,(int *)&local_20);
  }
  return this_local;
}

Assistant:

Debug& Debug::operator<<(unsigned char value) {
    /* Convert to int to avoid infinite recursion to operator<<(unsigned char) */
    const int v = value;

    /* Print the value as a shade of gray */
    if((_immediateFlags|_flags) & Flag::Color) {
        const char* shade;
        if(value < 51)       shade = "  ";
        else if(value < 102) shade = "░░";
        else if(value < 153) shade = "▒▒";
        else if(value < 204) shade = "▓▓";
        else                 shade = "██";

        /* If ANSI colors are disabled, use just the shade */
        if((_immediateFlags|_flags) & Flag::DisableColors)
            return print(shade);
        else {
            print("\033[38;2;");

            /* Disable space between values for everything after the initial
               value */
            const Flags previousFlags = _flags;
            _flags = previousFlags|Flag::NoSpace;

            /* Set both background and foreground, reset back after */
            *this << v << ";" << v << ";" << v << "m\033[48;2;"
                << v << ";" << v << ";" << v << "m" << shade << "\033[0m";

            /* Reset original flags */
            _flags = previousFlags;
            return *this;
        }

    /* Otherwise print its numeric value */
    } else return print(v);
}